

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
ctemplate::BaseArena::GetMemoryWithHandle(BaseArena *this,size_t size,Handle *handle)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  AllocatedBlock *pAVar4;
  ulong uVar5;
  
  if (handle == (Handle *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","handle != NULL");
  }
  else {
    pcVar3 = (char *)GetMemory(this,size,1 << ((byte)this->handle_alignment_bits_ & 0x1f));
    uVar2 = block_count(this);
    uVar5 = (ulong)uVar2;
    while (0 < (int)uVar5) {
      uVar2 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar2;
      pAVar4 = IndexToBlock(this,uVar2);
      pcVar1 = pAVar4->mem;
      if ((pcVar1 <= pcVar3) && (pcVar3 < pcVar1 + pAVar4->size)) {
        uVar5 = (ulong)(pcVar3 + ((uVar5 << ((byte)this->block_size_bits_ & 0x3f)) - (long)pcVar1))
                >> ((byte)this->handle_alignment_bits_ & 0x3f);
        if (0xfffffffe < uVar5) {
          uVar5 = 0xffffffff;
        }
        *(int *)handle = (int)uVar5;
        return pcVar3;
      }
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","block_index",">=","0");
  }
  exit(1);
}

Assistant:

void* BaseArena::GetMemoryWithHandle(
    const size_t size, BaseArena::Handle* handle) {
  CHECK(handle != NULL);
  // For efficiency, handles are always allocated aligned to a power of 2.
  void* p = GetMemory(size, (1 << handle_alignment_bits_));
  // Find the index of the block the memory was allocated from. In most
  // cases, this will be the last block, so the following loop will
  // iterate exactly once.
  int block_index;
  const AllocatedBlock* block = NULL;
  for (block_index = block_count() - 1; block_index >= 0; --block_index) {
    block = IndexToBlock(block_index);
    if ((p >= block->mem) && (p < (block->mem + block->size))) {
      break;
    }
  }
  CHECK_GE(block_index, 0) << "Failed to find block that was allocated from";
  CHECK(block != NULL) << "Failed to find block that was allocated from";
  const uint64 offset = reinterpret_cast<char*>(p) - block->mem;
  DCHECK_LT(offset, block_size_);
  DCHECK((offset & ((1 << handle_alignment_bits_) - 1)) == 0);
  DCHECK((block_size_ & ((1 << handle_alignment_bits_) - 1)) == 0);
  uint64 handle_value =
      ((static_cast<uint64>(block_index) << block_size_bits_) + offset) >>
      handle_alignment_bits_;
  if (handle_value >= static_cast<uint64>(0xFFFFFFFF)) {
    // We ran out of space to be able to return a handle, so return an invalid
    // handle.
    handle_value = Handle::kInvalidValue;
  }
  handle->handle_ = static_cast<uint32>(handle_value);
  return p;
}